

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

void xmlRegisterHTTPPostCallbacks(void)

{
  long lVar1;
  
  if (xmlOutputCallbackInitialized == '\0') {
    xmlRegisterDefaultOutputCallbacks();
  }
  lVar1 = (long)xmlOutputCallbackNr;
  if (lVar1 < 0xf) {
    xmlOutputCallbackTable[lVar1].matchcallback = xmlIOHTTPMatch;
    xmlOutputCallbackTable[lVar1].opencallback = xmlIOHTTPDfltOpenW;
    xmlOutputCallbackTable[lVar1].writecallback = xmlIOHTTPWrite;
    xmlOutputCallbackTable[lVar1].closecallback = xmlIOHTTPClosePost;
    xmlOutputCallbackInitialized = '\x01';
    xmlOutputCallbackNr = xmlOutputCallbackNr + 1;
  }
  return;
}

Assistant:

void
xmlRegisterHTTPPostCallbacks( void ) {

    /*  Register defaults if not done previously  */

    if ( xmlOutputCallbackInitialized == 0 )
	xmlRegisterDefaultOutputCallbacks( );

    xmlRegisterOutputCallbacks(xmlIOHTTPMatch, xmlIOHTTPDfltOpenW,
	                       xmlIOHTTPWrite, xmlIOHTTPClosePost);
    return;
}